

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O0

ScriptFunction *
Js::ScriptFunction::OP_NewClassConstructor
          (FrameDisplay *environment,FunctionInfoPtrPtr infoRef,Var homeObj,
          RecyclableObject *constructorParent)

{
  code *pcVar1;
  Var pvVar2;
  bool bVar3;
  byte bVar4;
  ArgSlot AVar5;
  FunctionInfo *pFVar6;
  FunctionProxy *pFVar7;
  ScriptContext *pSVar8;
  ThreadContext *threadContext;
  ScriptFunctionType *pSVar9;
  JavascriptLibrary *pJVar10;
  RecyclableObject *pRVar11;
  ParseableFunctionInfo *this;
  undefined4 *puVar12;
  ScriptFunctionType *local_d0;
  JavascriptString *pJStack_88;
  bool result;
  JavascriptString *functionName;
  Var length;
  ScriptFunction *scriptFunction;
  ScriptFunctionType *newType;
  DynamicTypeHandler *typeHandler;
  FunctionProxy *local_50;
  FunctionProxy *proxy;
  JsReentLock reentrancylock;
  RecyclableObject *constructorParent_local;
  Var homeObj_local;
  FunctionInfoPtrPtr infoRef_local;
  FrameDisplay *environment_local;
  
  reentrancylock._24_8_ = constructorParent;
  pFVar6 = Memory::WriteBarrierPtr<Js::FunctionInfo>::operator->(infoRef);
  pFVar7 = FunctionInfo::GetFunctionProxy(pFVar6);
  pSVar8 = FunctionProxy::GetScriptContext(pFVar7);
  threadContext = ScriptContext::GetThreadContext(pSVar8);
  JsReentLock::JsReentLock((JsReentLock *)&proxy,threadContext);
  pFVar6 = Memory::WriteBarrierPtr<Js::FunctionInfo>::operator->(infoRef);
  local_50 = FunctionInfo::GetFunctionProxy(pFVar6);
  pSVar9 = FunctionProxy::GetUndeferredFunctionType(local_50);
  if (pSVar9 == (ScriptFunctionType *)0x0) {
    bVar3 = FunctionProxy::GetIsAnonymousFunction(local_50);
    if (bVar3) {
      pSVar8 = FunctionProxy::GetScriptContext(local_50);
      pJVar10 = ScriptContext::GetLibrary(pSVar8);
      local_d0 = (ScriptFunctionType *)
                 JavascriptLibrary::AnonymousClassConstructorTypeHandler(pJVar10);
    }
    else {
      pSVar8 = FunctionProxy::GetScriptContext(local_50);
      pJVar10 = ScriptContext::GetLibrary(pSVar8);
      local_d0 = (ScriptFunctionType *)JavascriptLibrary::ClassConstructorTypeHandler(pJVar10);
    }
    newType = local_d0;
    scriptFunction =
         (ScriptFunction *)
         ScriptFunctionType::New
                   (local_50,(DynamicTypeHandler *)local_d0,
                    (RecyclableObject *)reentrancylock._24_8_,true);
    FunctionProxy::SetUndeferredFunctionType(local_50,(ScriptFunctionType *)scriptFunction);
  }
  length = OP_NewScFuncHomeObj(environment,infoRef,homeObj);
  pRVar11 = RecyclableObject::GetPrototype((RecyclableObject *)length);
  if (pRVar11 != (RecyclableObject *)reentrancylock._24_8_) {
    (**(code **)(*length + 600))(length,reentrancylock._24_8_);
  }
  pFVar6 = Memory::WriteBarrierPtr<Js::FunctionInfo>::operator->(infoRef);
  pFVar7 = FunctionInfo::GetFunctionProxy(pFVar6);
  this = FunctionProxy::EnsureDeserialized(pFVar7);
  AVar5 = ParseableFunctionInfo::GetReportedInParamsCount(this);
  functionName = (JavascriptString *)TaggedInt::ToVarUnchecked(AVar5 - 1);
  DynamicObject::SetSlot((DynamicObject *)length,-1,false,1,functionName);
  bVar4 = (**(code **)(*length + 0x3b8))();
  if ((bVar4 & 1) == 0) {
    pFVar6 = JavascriptFunction::GetFunctionInfo((JavascriptFunction *)length);
    bVar3 = FunctionInfo::HasComputedName(pFVar6);
    if (!bVar3) {
      pJStack_88 = (JavascriptString *)0x0;
      bVar3 = JavascriptFunction::GetFunctionName
                        ((JavascriptFunction *)length,&stack0xffffffffffffff78);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                    ,0xa1,"(result)","result");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      DynamicObject::SetSlot((DynamicObject *)length,-1,false,2,pJStack_88);
    }
  }
  pvVar2 = length;
  JsReentLock::~JsReentLock((JsReentLock *)&proxy);
  return (ScriptFunction *)pvVar2;
}

Assistant:

ScriptFunction * ScriptFunction::OP_NewClassConstructor(FrameDisplay *environment, FunctionInfoPtrPtr infoRef, Var homeObj, RecyclableObject *constructorParent)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrFunc_OP_NewClassConstructor, reentrancylock, (*infoRef)->GetFunctionProxy()->GetScriptContext()->GetThreadContext());
        FunctionProxy * proxy = (*infoRef)->GetFunctionProxy();
        if (proxy->GetUndeferredFunctionType() == nullptr)
        {
            DynamicTypeHandler * typeHandler = proxy->GetIsAnonymousFunction() 
                ? proxy->GetScriptContext()->GetLibrary()->AnonymousClassConstructorTypeHandler()
                : proxy->GetScriptContext()->GetLibrary()->ClassConstructorTypeHandler();
            ScriptFunctionType * newType = ScriptFunctionType::New(proxy, typeHandler, constructorParent, true);
            proxy->SetUndeferredFunctionType(newType);
        }
        ScriptFunction * scriptFunction = OP_NewScFuncHomeObj(environment, infoRef, homeObj);
        if (scriptFunction->GetPrototype() != constructorParent)
        {
            scriptFunction->SetPrototype(constructorParent);
        }

        Var length = TaggedInt::ToVarUnchecked((*infoRef)->GetFunctionProxy()->EnsureDeserialized()->GetReportedInParamsCount() - 1);
        scriptFunction->SetSlot(SetSlotArguments(Constants::NoProperty, 1, length));

        if (!scriptFunction->IsAnonymousFunction() && !scriptFunction->GetFunctionInfo()->HasComputedName())
        {
            JavascriptString * functionName = nullptr;
            bool result = scriptFunction->GetFunctionName(&functionName);
            Assert(result);
            scriptFunction->SetSlot(SetSlotArguments(Constants::NoProperty, 2, functionName));
        }

        return scriptFunction;
        JIT_HELPER_END(ScrFunc_OP_NewClassConstructor);
    }